

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,ArrayElementRef *a)

{
  bool bVar1;
  Expression *pEVar2;
  Expression *parent;
  Variable *pVVar3;
  ArrayElement *pAVar4;
  SliceRange SVar5;
  CodeLocation local_88;
  Expression *local_78;
  Expression *index;
  CodeLocation local_68;
  ArraySize local_58;
  SliceRange sliceRange;
  Expression *source;
  Type arrayOrVectorType;
  ArrayElementRef *a_local;
  HEARTGenerator *this_local;
  
  arrayOrVectorType.structure.object = (Structure *)a;
  getArrayOrVectorType((Type *)&source,this,a);
  pEVar2 = pool_ptr<soul::AST::Expression>::operator*
                     ((pool_ptr<soul::AST::Expression> *)
                      ((arrayOrVectorType.structure.object)->members).space);
  parent = evaluateAsExpression(this,pEVar2,(Type *)&source);
  if ((((arrayOrVectorType.structure.object)->members).space[3] & 1) == 0) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator*
                       ((pool_ptr<soul::AST::Expression> *)
                        (((arrayOrVectorType.structure.object)->members).space + 1));
    local_78 = evaluateAsExpression(this,pEVar2);
    bVar1 = pool_ptr<soul::heart::Variable>::operator!=(&this->currentTargetVariable,(void *)0x0);
    if (bVar1) {
      pVVar3 = pool_ptr<soul::heart::Variable>::operator*(&this->currentTargetVariable);
      CodeLocation::CodeLocation
                (&local_88,(CodeLocation *)&(arrayOrVectorType.structure.object)->activeUseFlag);
      pAVar4 = BlockBuilder::createDynamicSubElement
                         (&(this->builder).super_BlockBuilder,&local_88,parent,local_78,false,
                          (bool)(*(byte *)((long)((arrayOrVectorType.structure.object)->members).
                                                 space + 0x19) & 1));
      BlockBuilder::addCastOrAssignment
                (&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,
                 &pAVar4->super_Expression);
      CodeLocation::~CodeLocation(&local_88);
    }
    index._4_4_ = 0;
  }
  else {
    SVar5 = AST::ArrayElementRef::getResolvedSliceRange
                      ((ArrayElementRef *)arrayOrVectorType.structure.object);
    sliceRange.start = SVar5.end;
    local_58 = SVar5.start;
    bVar1 = pool_ptr<soul::heart::Variable>::operator!=(&this->currentTargetVariable,(void *)0x0);
    if (bVar1) {
      pVVar3 = pool_ptr<soul::heart::Variable>::operator*(&this->currentTargetVariable);
      CodeLocation::CodeLocation
                (&local_68,(CodeLocation *)&(arrayOrVectorType.structure.object)->activeUseFlag);
      pAVar4 = BlockBuilder::createFixedArraySlice
                         (&(this->builder).super_BlockBuilder,&local_68,parent,local_58,
                          sliceRange.start);
      BlockBuilder::addCastOrAssignment
                (&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,
                 &pAVar4->super_Expression);
      CodeLocation::~CodeLocation(&local_68);
    }
    index._4_4_ = 1;
  }
  Type::~Type((Type *)&source);
  return;
}

Assistant:

void visit (AST::ArrayElementRef& a) override
    {
        auto arrayOrVectorType = getArrayOrVectorType (a);
        auto& source = evaluateAsExpression (*a.object, arrayOrVectorType);

        if (a.isSlice)
        {
            auto sliceRange = a.getResolvedSliceRange();

            if (currentTargetVariable != nullptr)
                builder.addCastOrAssignment (*currentTargetVariable,
                                             builder.createFixedArraySlice (a.context.location,
                                                                            source, sliceRange.start, sliceRange.end));
            return;
        }

        auto& index = evaluateAsExpression (*a.startIndex);

        if (currentTargetVariable != nullptr)
            builder.addCastOrAssignment (*currentTargetVariable,
                                         builder.createDynamicSubElement (a.context.location, source, index,
                                                                          false, a.suppressWrapWarning));
    }